

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Float::stDiv(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar3;
  double dVar4;
  double fb;
  double fa;
  Oop b;
  Oop a;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 1) {
    b.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    b.field_0.uintValue._4_4_ = extraout_var_00;
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    fa = (double)CONCAT44(extraout_var_01,iVar2);
    bVar1 = Oop::isFloatOrInt(&b);
    if ((bVar1) && (bVar1 = Oop::isFloatOrInt((Oop *)&fa), bVar1)) {
      dVar3 = Oop::decodeFloatOrInt(&b);
      dVar4 = Oop::decodeFloatOrInt((Oop *)&fa);
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x14])(dVar3 / dVar4);
    }
    else {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Float::stDiv(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isFloatOrInt() || !b.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fa = a.decodeFloatOrInt();
    auto fb = b.decodeFloatOrInt();
    return interpreter->returnFloat(fa / fb);
}